

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

sockaddr_in get_address(char *strip,char *strport)

{
  sockaddr_in sVar1;
  int iVar2;
  hostent *phVar3;
  sockaddr_in addr;
  
  bzero(&addr,0x10);
  addr.sin_family = 2;
  iVar2 = atoi(strport);
  addr.sin_port = (ushort)iVar2 << 8 | (ushort)iVar2 >> 8;
  phVar3 = gethostbyname(strip);
  memcpy(&addr.sin_addr,*phVar3->h_addr_list,(long)phVar3->h_length);
  sVar1.sin_port = addr.sin_port;
  sVar1.sin_family = addr.sin_family;
  sVar1.sin_addr.s_addr = addr.sin_addr.s_addr;
  sVar1.sin_zero[0] = addr.sin_zero[0];
  sVar1.sin_zero[1] = addr.sin_zero[1];
  sVar1.sin_zero[2] = addr.sin_zero[2];
  sVar1.sin_zero[3] = addr.sin_zero[3];
  sVar1.sin_zero[4] = addr.sin_zero[4];
  sVar1.sin_zero[5] = addr.sin_zero[5];
  sVar1.sin_zero[6] = addr.sin_zero[6];
  sVar1.sin_zero[7] = addr.sin_zero[7];
  return sVar1;
}

Assistant:

struct sockaddr_in get_address(char *strip, char *strport) {
    struct sockaddr_in addr;
    bzero(&addr, sizeof(struct sockaddr_in));
    addr.sin_family = PF_INET;
    addr.sin_port = htons((unsigned short)atoi(strport));
    struct hostent *host_info = gethostbyname(strip);
    memcpy(&(addr.sin_addr), host_info->h_addr, (size_t)host_info->h_length);
    return addr;
}